

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  allocator_type local_41;
  ExpectationBase *next;
  vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
  expectations;
  
  bVar2 = is_retired(this);
  if (!bVar2) {
    next = this;
    std::
    vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
    ::vector(&expectations,1,&next,&local_41);
    while (expectations.
           super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           expectations.
           super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      pEVar1 = expectations.
               super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      expectations.
      super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           expectations.
           super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      for (p_Var3 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        next = *(ExpectationBase **)(p_Var3 + 1);
        bVar2 = is_retired(next);
        if (!bVar2) {
          Retire(next);
          std::
          vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
          ::push_back(&expectations,&next);
        }
      }
    }
    std::
    _Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
    ::~_Vector_base(&expectations.
                     super__Vector_base<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
                   );
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  ::std::vector<ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      ExpectationBase* next = it->expectation_base().get();
      if (!next->is_retired()) {
        next->Retire();
        expectations.push_back(next);
      }
    }
  }
}